

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uchar * readEncoded(string *fileName,uchar **occurences,int *width,int *height,int *maximum)

{
  int iVar1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  uchar *puVar3;
  uchar *puVar4;
  size_t sVar5;
  ulong uVar6;
  uchar *local_58;
  uchar *readEncoded;
  uchar *readOccurence;
  uchar *encodedPixels;
  int sizeOccurences;
  int size;
  FILE *fr;
  int *maximum_local;
  int *height_local;
  int *width_local;
  uchar **occurences_local;
  string *fileName_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  __isoc99_fscanf(__stream,"%d\n %d\n",width,height);
  __isoc99_fscanf(__stream,"%d\n",maximum);
  printf("DECODING\n");
  printf("Width: %d\n",(ulong)(uint)*width);
  printf("Height: %d\n",(ulong)(uint)*height);
  printf("maximum: %d\n\n",(ulong)(uint)*maximum);
  iVar1 = *width;
  iVar2 = *height;
  uVar6 = (ulong)(*width * *height * 3);
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar3 = (uchar *)operator_new__(uVar6);
  uVar6 = (ulong)(iVar1 * iVar2);
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (uchar *)operator_new__(uVar6);
  *occurences = puVar4;
  local_58 = puVar3;
  readEncoded = *occurences;
  while( true ) {
    sVar5 = fread(readEncoded,1,1,__stream);
    if (sVar5 == 0) break;
    fread(local_58,1,3,__stream);
    local_58 = local_58 + 3;
    readEncoded = readEncoded + 1;
  }
  fclose(__stream);
  return puVar3;
}

Assistant:

unsigned char* readEncoded(string fileName, unsigned char** occurences, int& width, int& height, int& maximum)
{
    // open the file to read
    FILE* fr = fopen(fileName.c_str(), "rb");

    // read the width, height and maximum
    fscanf(fr, "%d\n %d\n", &width, &height);
    fscanf(fr, "%d\n", &maximum);

    // check to see if they were stored properly
    printf("DECODING\n");
    printf("Width: %d\n", width);
    printf("Height: %d\n", height);
    printf("maximum: %d\n\n", maximum);

    int size = width * height * 3;
    int sizeOccurences = width * height;

    // allocate array for pixels
    unsigned char* encodedPixels = new unsigned char[size];
    *occurences = new unsigned char[sizeOccurences];

    unsigned char* readOccurence = *occurences;
    unsigned char* readEncoded = encodedPixels;

    while (fread(readOccurence++, 1, 1, fr)) 
    {
        fread(readEncoded, 1, 3, fr);
        readEncoded += 3;
    }
    fclose(fr);
    return encodedPixels;
}